

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O0

void __thiscall LINAnalyzerSettings::LINAnalyzerSettings(LINAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar1;
  AnalyzerSettingInterfaceNumberList *this_01;
  element_type *peVar2;
  AnalyzerSettingInterfaceInteger *this_02;
  element_type *peVar3;
  ulong uVar4;
  Channel *pCVar5;
  char *pcVar6;
  uint uVar7;
  LINAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__LINAnalyzerSettings_00118d60;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mLINVersion = 2.0;
  this->mBitRate = 20000;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mInputChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mLINVersionInterface,(element_type *)0x0);
  uVar4 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mBitRateInterface,(element_type *)0x0);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mInputChannelInterface,this_00);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar1,"Serial");
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  pCVar5 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  this_01 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_01);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mLINVersionInterface,this_01);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mLINVersionInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"LIN Version");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mLINVersionInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar2,"Version 1.x");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mLINVersionInterface);
  pcVar6 = "Version 2.x";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar2,"Version 2.x");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mLINVersionInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mLINVersion);
  this_02 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar6);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_02);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(&this->mBitRateInterface,this_02);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Bit Rate (Bits/s)");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)peVar3);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)peVar3);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar3);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mLINVersionInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::get(&this->mBitRateInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar7 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar7,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

LINAnalyzerSettings::LINAnalyzerSettings() : mInputChannel( UNDEFINED_CHANNEL ), mLINVersion( 2.0 ), mBitRate( 20000 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Serial", "Standard LIN" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mLINVersionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mLINVersionInterface->SetTitleAndTooltip( "LIN Version", "Specify the LIN protocol version 1 or 2." );
    mLINVersionInterface->AddNumber( 1.0, "Version 1.x", "LIN Protocol Specification Version 1.x" );
    mLINVersionInterface->AddNumber( 2.0, "Version 2.x", "LIN Protocol Specification Version 2.x" );
    mLINVersionInterface->SetNumber( mLINVersion );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 1000000 );
    mBitRateInterface->SetMin( 1000 );
    mBitRateInterface->SetInteger( mBitRate );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mLINVersionInterface.get() );
    AddInterface( mBitRateInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}